

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O2

void __thiscall klogic::mlmvn::dump_errors(mlmvn *this)

{
  ostream *poVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  pointer pvVar5;
  
  uVar4 = 0;
  while (uVar4 < (ulong)(((long)(this->neurons).
                                super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->neurons).
                               super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
    pvVar5 = (this->errors).
             super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar4;
    uVar4 = uVar4 + 1;
    lVar3 = 0;
    uVar2 = 0;
    while (uVar2 < (ulong)((long)*(pointer *)
                                  ((long)&(pvVar5->
                                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                          )._M_impl.super__Vector_impl_data + 8) -
                           *(long *)&(pvVar5->
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     )._M_impl.super__Vector_impl_data >> 4)) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"Delta[");
      uVar2 = uVar2 + 1;
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar2);
      poVar1 = std::operator<<(poVar1,',');
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar4);
      poVar1 = std::operator<<(poVar1,"] = ");
      poVar1 = std::operator<<(poVar1,(complex *)
                                      (*(long *)&(pvVar5->
                                                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                                 )._M_impl.super__Vector_impl_data + lVar3));
      std::endl<char,std::char_traits<char>>(poVar1);
      lVar3 = lVar3 + 0x10;
    }
  }
  return;
}

Assistant:

void klogic::mlmvn::dump_errors() const
{
    for (int layer = 0; layer < layers_count(); ++layer) {
        const cvector &layer_errs = errors[layer];

        for (int k = 0; k < layer_errs.size(); ++k) {
            std::cerr << "Delta[" << (k+1) << ',' << (layer+1) << "] = " << layer_errs[k] << std::endl;
        }
    }
}